

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>
               (void)

{
  _List_node_base *__args;
  uint *__args_1;
  _Base_ptr p_Var1;
  bool bVar2;
  Column_zp_settings *this;
  _Rb_tree_node_base *p_Var3;
  undefined1 *puVar4;
  _List_node_base *p_Var5;
  undefined4 local_514;
  undefined4 *local_510;
  _Base_ptr local_508;
  undefined **local_500;
  ulong local_4f8;
  shared_count sStack_4f0;
  undefined4 **local_4e8;
  undefined8 local_4e0;
  uint local_4d8 [2];
  undefined8 *local_4d0;
  _Base_ptr *local_4c8;
  undefined1 local_4c0 [8];
  undefined8 local_4b8;
  shared_count sStack_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined **local_498;
  char *local_490;
  undefined8 *local_488;
  char *local_480;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>
  m;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>>
            ();
  this = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>
  ::Column_zp_settings::Column_zp_settings(this,5);
  m.colSettings_ = this;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>
  ::
  Chain_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>
              *)&m.matrix_,&columns,this);
  build_longer_chain_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>>
            ();
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       columns.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       columns.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  bars1._M_t._M_impl._0_8_ =
       columns.
       super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  columns.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)bars2._M_t._M_impl._0_8_;
  columns.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  columns.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  bars2._M_t._M_impl._0_8_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&bars1);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&bars2);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>
            (&columns,&m);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((Chain_pairing_option *)
      m.matrix_.super_Chain_pairing_option.barcode_.
      super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != &m.matrix_.super_Chain_pairing_option) {
    p_Var5 = m.matrix_.super_Chain_pairing_option.barcode_.
             super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    do {
      __args = p_Var5 + 1;
      __args_1 = (uint *)((long)&p_Var5[1]._M_next + 4);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars1,(int *)__args,__args_1,(uint *)&p_Var5[1]._M_prev);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars2,(int *)__args,__args_1,(uint *)&p_Var5[1]._M_prev);
      local_4d8[0] = *(uint *)&p_Var5[1]._M_prev;
      local_4e0 = (undefined **)__args->_M_next;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars3,(int *)&local_4e0,(uint *)((long)&local_4e0 + 4),local_4d8);
      p_Var5 = p_Var5->_M_next;
    } while ((Chain_pairing_option *)p_Var5 != &m.matrix_.super_Chain_pairing_option);
  }
  p_Var1 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_170,0x574);
  local_490 = (char *)((ulong)local_490 & 0xffffffffffffff00);
  local_498 = &PTR__lazy_ostream_00242128;
  local_488 = &boost::unit_test::lazy_ostream::inst;
  local_480 = "";
  local_508 = (_Base_ptr)&p_Var1[1]._M_parent;
  local_510 = &local_514;
  local_514 = 0;
  local_4c0[0] = *(int *)&p_Var1[1]._M_parent == 0;
  local_4b8 = 0;
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a0 = "";
  local_4c8 = &local_508;
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_002420e8;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_4f8 = local_4f8 & 0xffffffffffffff00;
  local_4e8 = &local_510;
  local_500 = &PTR__lazy_ostream_002420e8;
  sStack_4f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x575);
  local_490 = (char *)((ulong)local_490 & 0xffffffffffffff00);
  local_498 = &PTR__lazy_ostream_00242128;
  local_488 = &boost::unit_test::lazy_ostream::inst;
  local_480 = "";
  local_514 = 0;
  local_4c0[0] = *(int *)&p_Var1[1].field_0x4 == 0;
  local_508 = (_Base_ptr)&p_Var1[1].field_0x4;
  local_4b8 = 0;
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a0 = "";
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_002420e8;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_508;
  local_510 = &local_514;
  local_4f8 = local_4f8 & 0xffffffffffffff00;
  local_500 = &PTR__lazy_ostream_002420e8;
  sStack_4f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_510;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x577);
  local_508 = p_Var1 + 1;
  local_490 = (char *)((ulong)local_490 & 0xffffffffffffff00);
  local_498 = &PTR__lazy_ostream_00242128;
  local_488 = &boost::unit_test::lazy_ostream::inst;
  local_480 = "";
  local_514 = 0xffffffff;
  local_4c0[0] = local_508->_M_color == ~_S_red;
  local_4b8 = 0;
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a0 = "";
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_002420e8;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_508;
  local_510 = &local_514;
  local_4f8 = local_4f8 & 0xffffffffffffff00;
  local_500 = &PTR__lazy_ostream_002420e8;
  sStack_4f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_510;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x579);
  local_490 = (char *)((ulong)local_490 & 0xffffffffffffff00);
  local_498 = &PTR__lazy_ostream_00242128;
  local_488 = &boost::unit_test::lazy_ostream::inst;
  local_480 = "";
  local_514 = 0;
  local_4c0[0] = *(int *)&p_Var3[1]._M_parent == 0;
  local_508 = (_Base_ptr)&p_Var3[1]._M_parent;
  local_4b8 = 0;
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a0 = "";
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_002420e8;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_508;
  local_510 = &local_514;
  local_4f8 = local_4f8 & 0xffffffffffffff00;
  local_500 = &PTR__lazy_ostream_002420e8;
  sStack_4f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_510;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x57a);
  local_490 = (char *)((ulong)local_490 & 0xffffffffffffff00);
  local_498 = &PTR__lazy_ostream_00242128;
  local_488 = &boost::unit_test::lazy_ostream::inst;
  local_480 = "";
  local_514 = 1;
  local_4c0[0] = *(int *)&p_Var3[1].field_0x4 == 1;
  local_508 = (_Base_ptr)&p_Var3[1].field_0x4;
  local_4b8 = 0;
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a0 = "";
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_002420e8;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_508;
  local_510 = &local_514;
  local_4f8 = local_4f8 & 0xffffffffffffff00;
  local_500 = &PTR__lazy_ostream_002420e8;
  sStack_4f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_510;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_210,0x57b);
  local_508 = p_Var3 + 1;
  local_490 = (char *)((ulong)local_490 & 0xffffffffffffff00);
  local_498 = &PTR__lazy_ostream_00242128;
  local_488 = &boost::unit_test::lazy_ostream::inst;
  local_480 = "";
  local_514 = 3;
  local_4c0[0] = local_508->_M_color == 3;
  local_4b8 = 0;
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a0 = "";
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_002420e8;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_508;
  local_510 = &local_514;
  local_4f8 = local_4f8 & 0xffffffffffffff00;
  local_500 = &PTR__lazy_ostream_002420e8;
  sStack_4f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_510;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_230,0x57d);
  local_490 = (char *)((ulong)local_490 & 0xffffffffffffff00);
  local_498 = &PTR__lazy_ostream_00242128;
  local_488 = &boost::unit_test::lazy_ostream::inst;
  local_480 = "";
  local_514 = 0;
  local_4c0[0] = *(int *)&p_Var3[1]._M_parent == 0;
  local_508 = (_Base_ptr)&p_Var3[1]._M_parent;
  local_4b8 = 0;
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a0 = "";
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_002420e8;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_508;
  local_510 = &local_514;
  local_4f8 = local_4f8 & 0xffffffffffffff00;
  local_500 = &PTR__lazy_ostream_002420e8;
  sStack_4f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_510;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x57e);
  local_490 = (char *)((ulong)local_490 & 0xffffffffffffff00);
  local_498 = &PTR__lazy_ostream_00242128;
  local_488 = &boost::unit_test::lazy_ostream::inst;
  local_480 = "";
  local_514 = 2;
  local_4c0[0] = *(int *)&p_Var3[1].field_0x4 == 2;
  local_508 = (_Base_ptr)&p_Var3[1].field_0x4;
  local_4b8 = 0;
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a0 = "";
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_002420e8;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_508;
  local_510 = &local_514;
  local_4f8 = local_4f8 & 0xffffffffffffff00;
  local_500 = &PTR__lazy_ostream_002420e8;
  sStack_4f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_510;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_270,0x57f);
  local_508 = p_Var3 + 1;
  local_490 = (char *)((ulong)local_490 & 0xffffffffffffff00);
  local_498 = &PTR__lazy_ostream_00242128;
  local_488 = &boost::unit_test::lazy_ostream::inst;
  local_480 = "";
  local_514 = 4;
  local_4c0[0] = local_508->_M_color == 4;
  local_4b8 = 0;
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a0 = "";
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_002420e8;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_508;
  local_510 = &local_514;
  local_4f8 = local_4f8 & 0xffffffffffffff00;
  local_500 = &PTR__lazy_ostream_002420e8;
  sStack_4f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_510;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_290,0x581);
  local_490 = (char *)((ulong)local_490 & 0xffffffffffffff00);
  local_498 = &PTR__lazy_ostream_00242128;
  local_488 = &boost::unit_test::lazy_ostream::inst;
  local_480 = "";
  local_514 = 0;
  local_4c0[0] = *(int *)&p_Var3[1]._M_parent == 0;
  local_508 = (_Base_ptr)&p_Var3[1]._M_parent;
  local_4b8 = 0;
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a0 = "";
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_002420e8;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_508;
  local_510 = &local_514;
  local_4f8 = local_4f8 & 0xffffffffffffff00;
  local_500 = &PTR__lazy_ostream_002420e8;
  sStack_4f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_510;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x582);
  local_490 = (char *)((ulong)local_490 & 0xffffffffffffff00);
  local_498 = &PTR__lazy_ostream_00242128;
  local_488 = &boost::unit_test::lazy_ostream::inst;
  local_480 = "";
  local_514 = 7;
  local_4c0[0] = *(int *)&p_Var3[1].field_0x4 == 7;
  local_508 = (_Base_ptr)&p_Var3[1].field_0x4;
  local_4b8 = 0;
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a0 = "";
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_002420e8;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_508;
  local_510 = &local_514;
  local_4f8 = local_4f8 & 0xffffffffffffff00;
  local_500 = &PTR__lazy_ostream_002420e8;
  sStack_4f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_510;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2d0,0x583);
  local_508 = p_Var3 + 1;
  local_490 = (char *)((ulong)local_490 & 0xffffffffffffff00);
  local_498 = &PTR__lazy_ostream_00242128;
  local_488 = &boost::unit_test::lazy_ostream::inst;
  local_480 = "";
  local_514 = 8;
  local_4c0[0] = local_508->_M_color == 8;
  local_4b8 = 0;
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a0 = "";
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_002420e8;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_508;
  local_510 = &local_514;
  local_4f8 = local_4f8 & 0xffffffffffffff00;
  local_500 = &PTR__lazy_ostream_002420e8;
  sStack_4f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_510;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f0,0x585);
  local_490 = (char *)((ulong)local_490 & 0xffffffffffffff00);
  local_498 = &PTR__lazy_ostream_00242128;
  local_488 = &boost::unit_test::lazy_ostream::inst;
  local_480 = "";
  local_514 = 1;
  local_4c0[0] = *(int *)&p_Var3[1]._M_parent == 1;
  local_508 = (_Base_ptr)&p_Var3[1]._M_parent;
  local_4b8 = 0;
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a0 = "";
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_002420e8;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_508;
  local_510 = &local_514;
  local_4f8 = local_4f8 & 0xffffffffffffff00;
  local_500 = &PTR__lazy_ostream_002420e8;
  sStack_4f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_510;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x586);
  local_490 = (char *)((ulong)local_490 & 0xffffffffffffff00);
  local_498 = &PTR__lazy_ostream_00242128;
  local_488 = &boost::unit_test::lazy_ostream::inst;
  local_480 = "";
  local_514 = 5;
  local_4c0[0] = *(int *)&p_Var3[1].field_0x4 == 5;
  local_508 = (_Base_ptr)&p_Var3[1].field_0x4;
  local_4b8 = 0;
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a0 = "";
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_002420e8;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_508;
  local_510 = &local_514;
  local_4f8 = local_4f8 & 0xffffffffffffff00;
  local_500 = &PTR__lazy_ostream_002420e8;
  sStack_4f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_510;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_330,0x587);
  local_508 = p_Var3 + 1;
  local_490 = (char *)((ulong)local_490 & 0xffffffffffffff00);
  local_498 = &PTR__lazy_ostream_00242128;
  local_488 = &boost::unit_test::lazy_ostream::inst;
  local_480 = "";
  local_514 = 6;
  local_4c0[0] = local_508->_M_color == 6;
  local_4b8 = 0;
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a0 = "";
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_002420e8;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_508;
  local_510 = &local_514;
  local_4f8 = local_4f8 & 0xffffffffffffff00;
  local_500 = &PTR__lazy_ostream_002420e8;
  sStack_4f0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4e8 = &local_510;
  boost::test_tools::tt_detail::report_assertion
            (local_4c0,&local_498,&local_4a8,0x587,1,2,2,"std::get<2>(*it)",&local_4e0,"6",
             &local_500);
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  puVar4 = (undefined1 *)std::_Rb_tree_increment(p_Var3);
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_350,0x589);
  local_500 = (undefined **)
              CONCAT71(local_500._1_7_,
                       (_Rb_tree_header *)puVar4 == &bars1._M_t._M_impl.super__Rb_tree_header);
  local_4f8 = 0;
  sStack_4f0.pi_ = (sp_counted_base *)0x0;
  local_498 = (undefined **)0x20062b;
  local_490 = "";
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_00242268;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_368 = "";
  local_4c8 = (_Base_ptr *)&local_498;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4f0);
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_380,0x58b);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars2._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar2 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar2 = false;
  }
  local_500 = (undefined **)CONCAT71(local_500._1_7_,bVar2);
  local_4f8 = 0;
  sStack_4f0.pi_ = (sp_counted_base *)0x0;
  local_498 = (undefined **)0x20063d;
  local_490 = "";
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_00242268;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_398 = "";
  local_4c8 = (_Base_ptr *)&local_498;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4f0);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3a8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3b0,0x58c);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars3._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar2 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar2 = false;
  }
  local_500 = (undefined **)CONCAT71(local_500._1_7_,bVar2);
  local_4f8 = 0;
  sStack_4f0.pi_ = (sp_counted_base *)0x0;
  local_498 = (undefined **)0x20064c;
  local_490 = "";
  local_4d8[0] = local_4d8[0] & 0xffffff00;
  local_4e0 = &PTR__lazy_ostream_00242268;
  local_4d0 = &boost::unit_test::lazy_ostream::inst;
  local_4c8 = (_Base_ptr *)&local_498;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4f0);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_barcode() {
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  const auto& barcode = m.get_current_barcode();

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    columns[5].clear();
  } else {
    columns = build_longer_chain_matrix<typename Matrix::Column>();
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::has_row_access) {
    std::vector<witness_content<typename Matrix::Column> > rows;
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      rows = build_longer_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_longer_chain_row_matrix<typename Matrix::Column>();
    }
    unsigned int i = 0;
    for (auto& r : rows) {
      if constexpr (Matrix::Option_list::has_removable_rows)
        if (i == 6) continue;
      test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
    }
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}